

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

void __thiscall Arbitrarychar16_t::~Arbitrarychar16_t(Arbitrarychar16_t *this)

{
  Arbitrarychar16_t *this_local;
  
  ~Arbitrarychar16_t(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(char16_t, Arbitrary)
{
  testinator::Arbitrary<char16_t> a;
  char16_t v = a.generate(0,0);
  a.shrink(v);
  return true;
}